

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
eastl::vector<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>::
DoInsertValue(vector<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
              *this,iterator position,value_type *value)

{
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> **pppVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar4;
  int iVar5;
  ulong uVar6;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar7;
  long lVar8;
  iterator ppVar9;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar10;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar11;
  
  pvVar2 = (this->
           super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
           ).mpEnd;
  if (pvVar2 == (this->
                super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                ).mpCapacity) {
    ppVar9 = (this->
             super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
             ).mpBegin;
    iVar5 = (int)((ulong)((long)pvVar2 - (long)ppVar9) >> 3);
    uVar6 = 1;
    if (iVar5 * -0x33333333 != 0) {
      uVar6 = (ulong)(uint)(iVar5 * -0x66666666);
    }
    if ((int)uVar6 == 0) {
      ppVar7 = (pair<char,_eastl::basic_string<char,_eastl::allocator>_> *)0x0;
      ppVar11 = ppVar7;
    }
    else {
      ppVar7 = (pair<char,_eastl::basic_string<char,_eastl::allocator>_> *)malloc(uVar6 * 0x28);
      ppVar11 = ppVar7;
    }
    for (; ppVar9 != position; ppVar9 = ppVar9 + 1) {
      ppVar7->first = ppVar9->first;
      (ppVar7->second).mpBegin = (value_type *)0x0;
      (ppVar7->second).mpEnd = (value_type *)0x0;
      (ppVar7->second).mpCapacity = (value_type *)0x0;
      (ppVar7->second).mpBegin = (ppVar9->second).mpBegin;
      (ppVar9->second).mpBegin = (value_type *)0x0;
      pvVar3 = (ppVar7->second).mpEnd;
      (ppVar7->second).mpEnd = (ppVar9->second).mpEnd;
      (ppVar9->second).mpEnd = pvVar3;
      pvVar3 = (ppVar7->second).mpCapacity;
      (ppVar7->second).mpCapacity = (ppVar9->second).mpCapacity;
      (ppVar9->second).mpCapacity = pvVar3;
      ppVar7 = ppVar7 + 1;
    }
    ppVar7->first = value->first;
    (ppVar7->second).mpBegin = (value_type *)0x0;
    (ppVar7->second).mpEnd = (value_type *)0x0;
    (ppVar7->second).mpCapacity = (value_type *)0x0;
    basic_string<char,_eastl::allocator>::RangeInitialize
              (&ppVar7->second,(value->second).mpBegin,(value->second).mpEnd);
    ppVar9 = (this->
             super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
             ).mpEnd;
    ppVar7 = ppVar7 + 1;
    if (ppVar9 != position) {
      do {
        ppVar7->first = position->first;
        (ppVar7->second).mpBegin = (value_type *)0x0;
        (ppVar7->second).mpEnd = (value_type *)0x0;
        (ppVar7->second).mpCapacity = (value_type *)0x0;
        (ppVar7->second).mpBegin = (position->second).mpBegin;
        (position->second).mpBegin = (value_type *)0x0;
        pvVar3 = (ppVar7->second).mpEnd;
        (ppVar7->second).mpEnd = (position->second).mpEnd;
        (position->second).mpEnd = pvVar3;
        pvVar3 = (ppVar7->second).mpCapacity;
        (ppVar7->second).mpCapacity = (position->second).mpCapacity;
        (position->second).mpCapacity = pvVar3;
        position = position + 1;
        ppVar7 = ppVar7 + 1;
      } while (position != ppVar9);
    }
    ppVar4 = (this->
             super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
             ).mpEnd;
    for (ppVar10 = (this->
                   super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                   ).mpBegin; ppVar10 < ppVar4; ppVar10 = ppVar10 + 1) {
      pvVar3 = (ppVar10->second).mpBegin;
      if ((pvVar3 != (value_type *)0x0) && (1 < (long)(ppVar10->second).mpCapacity - (long)pvVar3))
      {
        operator_delete__(pvVar3);
      }
    }
    ppVar10 = (this->
              super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
              ).mpBegin;
    if (ppVar10 != (pair<char,_eastl::basic_string<char,_eastl::allocator>_> *)0x0) {
      operator_delete__(ppVar10);
    }
    (this->
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    ).mpBegin = ppVar11;
    (this->
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    ).mpEnd = ppVar7;
    (this->
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    ).mpCapacity = ppVar11 + uVar6;
  }
  else {
    lVar8 = 0x28;
    if (pvVar2 <= value) {
      lVar8 = 0;
    }
    if (value < position) {
      lVar8 = 0;
    }
    ppVar9 = (iterator)(&value->first + lVar8);
    pvVar2->first = pvVar2[-1].first;
    (pvVar2->second).mpBegin = (value_type *)0x0;
    (pvVar2->second).mpEnd = (value_type *)0x0;
    (pvVar2->second).mpCapacity = (value_type *)0x0;
    basic_string<char,_eastl::allocator>::RangeInitialize
              (&pvVar2->second,pvVar2[-1].second.mpBegin,pvVar2[-1].second.mpEnd);
    ppVar7 = (this->
             super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
             ).mpEnd;
    copy_backward_impl<false,std::random_access_iterator_tag>::
    do_copy<eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*,eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*>
              (position,ppVar7 + -1,ppVar7);
    position->first = (&value->first)[lVar8];
    if (ppVar9 != position) {
      basic_string<char,_eastl::allocator>::assign
                (&position->second,(ppVar9->second).mpBegin,(ppVar9->second).mpEnd);
    }
    pppVar1 = &(this->
               super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
               ).mpEnd;
    *pppVar1 = *pppVar1 + 1;
  }
  return;
}

Assistant:

void vector<T, Allocator>::DoInsertValue(iterator position, const value_type& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        if(mpEnd != mpCapacity) // If size < capacity ...
        {
            // EASTL_ASSERT(position < mpEnd); // We don't call this function unless position is less than end, and the code directly below relies on this.
            // We need to take into account the possibility that value may come from within the vector itself.
            const T* pValue = &value;
            if((pValue >= position) && (pValue < mpEnd)) // If value comes from within the range to be moved...
                ++pValue;
            ::new(mpEnd) value_type(*(mpEnd - 1));
            eastl::copy_backward(position, mpEnd - 1, mpEnd); // We need copy_backward because of potential overlap issues.
            *position = *pValue;
            ++mpEnd;
        }
        else // else (size == capacity)
        {
            const size_type nPrevSize = size_type(mpEnd - mpBegin);
            const size_type nNewSize  = GetNewCapacity(nPrevSize);
            pointer const   pNewData  = DoAllocate(nNewSize);

#if EASTL_EXCEPTIONS_ENABLED
                pointer pNewEnd = pNewData;
                try
                {
                    pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                    ::new(pNewEnd) value_type(value);
                    pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
                }
                catch(...)
                {
                    DoDestroyValues(pNewData, pNewEnd);
                    DoFree(pNewData, nNewSize);
                    throw;
                }
#else
                pointer pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                ::new(pNewEnd) value_type(value);
                pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
#endif

            DoDestroyValues(mpBegin, mpEnd);
            DoFree(mpBegin, (size_type)(mpCapacity - mpBegin));

            mpBegin    = pNewData;
            mpEnd      = pNewEnd;
            mpCapacity = pNewData + nNewSize;
        }
    }